

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

BranchInstr *
Lowerer::GenerateProtoInlineCacheCheck
          (Instr *instrLdSt,RegOpnd *opndType,RegOpnd *inlineCache,LabelInstr *labelNext)

{
  IndirOpnd *src2;
  BranchInstr *pBVar1;
  
  src2 = IR::IndirOpnd::New(inlineCache,8,TyInt64,instrLdSt->m_func,false);
  InsertCompare(&opndType->super_Opnd,&src2->super_Opnd,instrLdSt);
  pBVar1 = InsertBranch(BrNeq_A,labelNext,instrLdSt);
  return pBVar1;
}

Assistant:

IR::BranchInstr *
Lowerer::GenerateProtoInlineCacheCheck(
    IR::Instr * instrLdSt,
    IR::RegOpnd * opndType,
    IR::RegOpnd * inlineCache,
    IR::LabelInstr * labelNext)
{
    // Generate:
    //
    //      CMP s1, [&(inlineCache->u.proto.type)]
    //      JNE $next

    IR::Opnd* typeOpnd = IR::IndirOpnd::New(inlineCache, (int32)offsetof(Js::InlineCache, u.proto.type), TyMachReg, instrLdSt->m_func);

    InsertCompare(opndType, typeOpnd, instrLdSt);
    return InsertBranch(Js::OpCode::BrNeq_A, labelNext, instrLdSt);
}